

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_scan_to_next_nonempty_line(Parser *this,size_t indentation)

{
  csubstr cVar1;
  size_t sVar2;
  bool bVar3;
  size_t in_RSI;
  ro_substr in_stack_00000000;
  size_t in_stack_00000020;
  Parser *in_stack_00000028;
  csubstr trimmed;
  csubstr next_peeked_triml;
  csubstr next_peeked;
  basic_substring<char_const> local_78 [16];
  basic_substring<const_char> local_68;
  basic_substring<const_char> local_58;
  basic_substring<const_char> *local_48;
  basic_substring<const_char> *pbVar4;
  basic_substring<const_char> local_18;
  basic_substring<const_char> *in_stack_fffffffffffffff8;
  
  basic_substring<const_char>::basic_substring
            ((basic_substring<const_char> *)&stack0xffffffffffffffc8);
  do {
    _local_48 = _peek_next_line(in_stack_00000028,in_stack_00000020);
    sVar2 = local_48._8_8_;
    pbVar4 = local_48;
    local_58 = basic_substring<const_char>::triml(local_48,local_48._15_1_);
    bVar3 = basic_substring<const_char>::begins_with(&local_58,'#');
    if (bVar3) {
      basic_substring<const_char>::basic_substring(&local_18);
      goto LAB_0031627e;
    }
    bVar3 = basic_substring<const_char>::begins_with
                      ((basic_substring<const_char> *)&stack0xffffffffffffffc8,' ',in_RSI);
    if (bVar3) {
      _advance_to_peeked((Parser *)trimmed.len);
      local_18.str = (char *)pbVar4;
      local_18.len = sVar2;
      goto LAB_0031627e;
    }
    basic_substring<char_const>::basic_substring<4ul>(local_78,(char (*) [4])0x35d781);
    local_68 = basic_substring<const_char>::trimr(in_stack_fffffffffffffff8,in_stack_00000000);
    in_stack_fffffffffffffff8 = &local_68;
    bVar3 = true;
    if (local_68.len != 0) {
      bVar3 = local_68.str == (char *)0x0;
    }
    if (!bVar3) {
      basic_substring<const_char>::basic_substring(&local_18);
      goto LAB_0031627e;
    }
    bVar3 = _advance_to_peeked((Parser *)trimmed.len);
  } while (bVar3);
  basic_substring<const_char>::basic_substring(&local_18);
LAB_0031627e:
  cVar1.len = local_18.len;
  cVar1.str = local_18.str;
  return cVar1;
}

Assistant:

csubstr Parser::_scan_to_next_nonempty_line(size_t indentation)
{
    csubstr next_peeked;
    while(true)
    {
        _c4dbgpf("rscalar: ... curr offset: {} indentation={}", m_state->pos.offset, indentation);
        next_peeked = _peek_next_line(m_state->pos.offset);
        csubstr next_peeked_triml = next_peeked.triml(' ');
        _c4dbgpf("rscalar: ... next peeked line='{}'", next_peeked.trimr("\r\n"));
        if(next_peeked_triml.begins_with('#'))
        {
            _c4dbgp("rscalar: ... first non-space character is #");
            return {};
        }
        else if(next_peeked.begins_with(' ', indentation))
        {
            _c4dbgpf("rscalar: ... begins at same indentation {}, assuming continuation", indentation);
            _advance_to_peeked();
            return next_peeked;
        }
        else   // check for de-indentation
        {
            csubstr trimmed = next_peeked_triml.trimr("\t\r\n");
            _c4dbgpf("rscalar: ... deindented! trimmed='{}'", trimmed);
            if(!trimmed.empty())
            {
                _c4dbgp("rscalar: ... and not empty. bailing out.");
                return {};
            }
        }
        if(!_advance_to_peeked())
        {
            _c4dbgp("rscalar: file finished");
            return {};
        }
    }
    return {};
}